

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O3

void simd::Flip(Image *in,uint32_t startXIn,uint32_t startYIn,Image *out,uint32_t startXOut,
               uint32_t startYOut,uint32_t width,uint32_t height,bool horizontal,bool vertical,
               SIMDType simdType)

{
  uint32_t rowSizeIn;
  SIMDType SVar1;
  uint uVar2;
  EVP_PKEY_CTX *src;
  ImageTemplate<unsigned_char> local_58;
  
  do {
    SVar1 = simdType;
    simdType = sse_function;
  } while (SVar1 == avx_function);
  if (SVar1 - sse_function < 2) {
    uVar2 = (uint)(SVar1 != neon_function) * 8 + 8;
    if (width < uVar2) {
LAB_001310c3:
      Image_Function::Flip
                (in,startXIn,startYIn,out,startXOut,startYOut,width,height,horizontal,vertical);
      return;
    }
  }
  else {
    if (SVar1 == cpu_function) goto LAB_001310c3;
    uVar2 = 0;
  }
  Image_Function::ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            (in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  local_58._data = (uchar *)0x0;
  local_58._type = out->_type;
  PenguinV_Image::ImageTemplate<unsigned_char>::copy(&local_58,(EVP_PKEY_CTX *)out,src);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(in);
  Image_Function::VerifyGrayScaleImage<PenguinV_Image::ImageTemplate<unsigned_char>>(&local_58);
  local_58._vptr_ImageTemplate = (_func_int **)&PTR__ImageTemplate_00215948;
  PenguinV_Image::ImageTemplate<unsigned_char>::clear(&local_58);
  if (horizontal || vertical) {
    if (SVar1 == sse_function) {
      rowSizeIn = in->_rowSize;
      sse::Flip(out,startXOut,startYOut,width,height,rowSizeIn,out->_rowSize,
                in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn),
                in->_data + (ulong)startXIn + (ulong)(startYIn * rowSizeIn) + rowSizeIn * height,
                horizontal,vertical,width / uVar2,uVar2 * (width / uVar2),width % uVar2);
    }
  }
  else {
    Image_Function::Copy(in,startXIn,startYIn,out,startXOut,startYOut,width,height);
  }
  return;
}

Assistant:

void Flip( const Image & in, uint32_t startXIn, uint32_t startYIn, Image & out, uint32_t startXOut, uint32_t startYOut,
               uint32_t width, uint32_t height, bool horizontal, bool vertical, SIMDType simdType )
    {
        uint32_t simdSize = getSimdSize( simdType );

        if( simdType == neon_function ) // for neon, because the algorithm used work with packet of 64 bit
            simdSize = 8u;

        if( (simdType == cpu_function) || (simdType == avx_function) || (width < simdSize) ) {
            AVX_CODE( Flip( in, startXIn, startYIn, out, startXOut, startYOut, width, height, horizontal, vertical, sse_function ); )

            Image_Function::Flip( in, startXIn, startYIn, out, startXOut, startYOut, width, height, horizontal, vertical );
            return;
        }

        Image_Function::ParameterValidation( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        Image_Function::VerifyGrayScaleImage( in, out );

        if( !horizontal && !vertical ) {
            Image_Function::Copy( in, startXIn, startYIn, out, startXOut, startYOut, width, height );
        }
        else {
            const uint32_t rowSizeIn  = in.rowSize();
            const uint32_t rowSizeOut = out.rowSize();

            const uint8_t * inY    = in.data() + startYIn * rowSizeIn + startXIn;
            const uint8_t * inYEnd = inY + height * rowSizeIn;

            const uint32_t simdWidth = width / simdSize;
            const uint32_t totalSimdWidth = simdWidth * simdSize;
            const uint32_t nonSimdWidth = width - totalSimdWidth;

            SSSE3_CODE( sse::Flip( out, startXOut, startYOut, width, height, rowSizeIn, rowSizeOut, inY, inYEnd, horizontal, 
                                   vertical, simdWidth, totalSimdWidth, nonSimdWidth ); )
            NEON_CODE( neon::Flip( out, startXOut, startYOut, width, height, rowSizeIn, rowSizeOut, inY, inYEnd, horizontal, 
                                   vertical, simdWidth, totalSimdWidth, nonSimdWidth ); )
        }
    }